

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.cpp
# Opt level: O0

void reportOption(FILE *file,HighsLogOptions *log_options,OptionRecordString *option,
                 bool report_only_deviations,HighsFileType file_type)

{
  __type _Var1;
  bool bVar2;
  string *from_string;
  undefined8 uVar3;
  undefined8 uVar4;
  byte in_CL;
  long in_RDX;
  HighsLogOptions *in_RSI;
  FILE *in_RDI;
  int in_R8D;
  string line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec8;
  FILE *pFVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  string *in_stack_fffffffffffffef8;
  string local_f0 [24];
  HighsInt in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [48];
  string local_60 [32];
  string local_40 [32];
  int local_20;
  byte local_19;
  long local_18;
  HighsLogOptions *local_10;
  FILE *local_8;
  
  local_19 = in_CL & 1;
  local_20 = in_R8D;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  _Var1 = std::operator==(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  if ((!_Var1) &&
     (((local_19 & 1) == 0 ||
      (bVar2 = std::operator!=(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8), bVar2)))) {
    if (local_20 == 4) {
      std::__cxx11::string::string(local_60,(string *)(local_18 + 0x10));
      highsInsertMdEscapes(in_stack_fffffffffffffef8);
      from_string = (string *)std::__cxx11::string::c_str();
      std::__cxx11::string::string(local_b0,(string *)(local_18 + 0x30));
      highsInsertMdEscapes(from_string);
      uVar3 = std::__cxx11::string::c_str();
      uVar4 = std::__cxx11::string::c_str();
      fprintf(local_8,"## %s\n- %s\n- Type: string\n- Default: \"%s\"\n\n",from_string,uVar3,uVar4);
      std::__cxx11::string::~string(local_90);
      std::__cxx11::string::~string(local_b0);
      std::__cxx11::string::~string(local_40);
      std::__cxx11::string::~string(local_60);
    }
    else if (local_20 == 1) {
      pFVar5 = local_8;
      uVar3 = std::__cxx11::string::c_str();
      fprintf(pFVar5,"\n# %s\n",uVar3);
      pFVar5 = local_8;
      highsBoolToString_abi_cxx11_((bool)in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28);
      uVar3 = std::__cxx11::string::c_str();
      uVar4 = std::__cxx11::string::c_str();
      fprintf(pFVar5,"# [type: string, advanced: %s, default: \"%s\"]\n",uVar3,uVar4);
      std::__cxx11::string::~string(local_d0);
      uVar3 = std::__cxx11::string::c_str();
      uVar4 = std::__cxx11::string::c_str();
      fprintf(local_8,"%s = %s\n",uVar3,uVar4);
    }
    else {
      uVar3 = std::__cxx11::string::c_str();
      uVar4 = std::__cxx11::string::c_str();
      highsFormatToString_abi_cxx11_((char *)local_f0,"Set option %s to \"%s\"\n",uVar3,uVar4);
      if (local_8 == _stdout) {
        uVar3 = std::__cxx11::string::c_str();
        highsLogUser(local_10,kInfo,"%s",uVar3);
      }
      else {
        uVar3 = std::__cxx11::string::c_str();
        fprintf(local_8,"%s",uVar3);
      }
      std::__cxx11::string::~string(local_f0);
    }
  }
  return;
}

Assistant:

void reportOption(FILE* file, const HighsLogOptions& log_options,
                  const OptionRecordString& option,
                  const bool report_only_deviations,
                  const HighsFileType file_type) {
  // Don't report for the options file if writing to an options file
  // Don't report options that can only be passed via the command line
  if (option.name == kOptionsFileString) return;
  // ToDo: are there others?

  if (!report_only_deviations || option.default_value != *option.value) {
    if (file_type == HighsFileType::kMd) {
      fprintf(file, "## %s\n- %s\n- Type: string\n- Default: \"%s\"\n\n",
              highsInsertMdEscapes(option.name).c_str(),
              highsInsertMdEscapes(option.description).c_str(),
              option.default_value.c_str());
    } else if (file_type == HighsFileType::kFull) {
      fprintf(file, "\n# %s\n", option.description.c_str());
      fprintf(file, "# [type: string, advanced: %s, default: \"%s\"]\n",
              highsBoolToString(option.advanced).c_str(),
              option.default_value.c_str());
      fprintf(file, "%s = %s\n", option.name.c_str(), (*option.value).c_str());
    } else {
      std::string line =
          highsFormatToString("Set option %s to \"%s\"\n", option.name.c_str(),
                              (*option.value).c_str());
      if (file == stdout) {
        highsLogUser(log_options, HighsLogType::kInfo, "%s", line.c_str());
      } else {
        fprintf(file, "%s", line.c_str());
      }
    }
  }
}